

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O3

Utest * __thiscall
TEST_DoublingFactorCounterTest_AllTriplets_ThreeClosedTriplets_TestShell::createTest
          (TEST_DoublingFactorCounterTest_AllTriplets_ThreeClosedTriplets_TestShell *this)

{
  TEST_DoublingFactorCounterTest_AllTriplets_ThreeClosedTriplets_Test *this_00;
  
  this_00 = (TEST_DoublingFactorCounterTest_AllTriplets_ThreeClosedTriplets_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                         ,0x174);
  TEST_DoublingFactorCounterTest_AllTriplets_ThreeClosedTriplets_Test::
  TEST_DoublingFactorCounterTest_AllTriplets_ThreeClosedTriplets_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, AllTriplets_ThreeClosedTriplets)
{
	addPair(Tile::WestWind);
	addTriplet(Tile::OneOfCharacters, false);
	addTriplet(Tile::TwoOfCircles, false);
	addTriplet(Tile::ThreeOfBamboos, false);
	addTriplet(Tile::SevenOfCharacters, false);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::AllTriplets));
	CHECK_EQUAL(1, r.patterns.count(Pattern::ThreeClosedTriplets));
	CHECK_EQUAL(4, r.doubling_factor);
}